

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_parser_parseIdentifierReferenceReference
          (sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sourcePosition;
  sysbvm_tuple_t token;
  sysbvm_parser_state_t *state_local;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_parser_lookAt(state,0);
  if (sVar1 == 0) {
    sVar1 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    context_local =
         (sysbvm_context_t *)
         sysbvm_astErrorNode_createWithCString(context,sVar1,"Expected an identifier.");
  }
  else {
    state->tokenPosition = state->tokenPosition + 1;
    sourcePosition = sysbvm_token_getSourcePosition(sVar1);
    sVar1 = sysbvm_token_getValue(sVar1);
    context_local =
         (sysbvm_context_t *)sysbvm_astIdentifierReferenceNode_create(context,sourcePosition,sVar1);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseIdentifierReferenceReference(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
    sysbvm_tuple_t token = sysbvm_parser_lookAt(state, 0);
    if(token == SYSBVM_NULL_TUPLE)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected an identifier.");

    ++state->tokenPosition;
    return sysbvm_astIdentifierReferenceNode_create(context, sysbvm_token_getSourcePosition(token), sysbvm_token_getValue(token));
}